

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool Catch::list(IEventListener *reporter,Config *config)

{
  key_type *pkVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  int iVar5;
  undefined4 extraout_var;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *pvVar6;
  undefined4 extraout_var_00;
  iterator iVar7;
  _Base_ptr p_Var8;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar9;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var_02;
  char cVar11;
  key_type *__k;
  undefined8 *puVar12;
  pointer pTVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_bool> pVar14;
  StringRef SVar15;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> descriptions;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases;
  map<Catch::StringRef,_Catch::TagInfo,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  tagCounts;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases_1;
  undefined1 local_118 [8];
  _Rb_tree_node_base _Stack_110;
  size_t local_f0;
  size_t sStack_e8;
  Config *local_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [48];
  IEventListener *local_88;
  pointer local_80;
  _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  local_78;
  _Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_48;
  
  cVar11 = (config->m_data).listTests;
  if ((bool)cVar11 == true) {
    iVar5 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pvVar6 = getAllTestCasesSorted(&config->super_IConfig);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)local_d8,
                pvVar6,(TestSpec *)CONCAT44(extraout_var,iVar5),&config->super_IConfig);
    (*reporter->_vptr_IEventListener[0x16])
              (reporter,(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                        local_d8);
    std::_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::~_Vector_base
              ((_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
               local_d8);
  }
  local_e0 = config;
  if ((config->m_data).listTags == true) {
    local_88 = reporter;
    iVar5 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pvVar6 = getAllTestCasesSorted(&config->super_IConfig);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)&local_48,
                pvVar6,(TestSpec *)CONCAT44(extraout_var_00,iVar5),&config->super_IConfig);
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_78._M_impl.super__Rb_tree_header._M_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_80 = local_48._M_impl.super__Vector_impl_data._M_finish;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pTVar13 = local_48._M_impl.super__Vector_impl_data._M_start; pTVar13 != local_80;
        pTVar13 = pTVar13 + 1) {
      pkVar1 = &((pTVar13->m_info->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->original;
      for (__k = &((pTVar13->m_info->tags).
                   super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                   super__Vector_impl_data._M_start)->original; __k != pkVar1; __k = __k + 1) {
        iVar7 = std::
                _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
                ::find(&local_78,__k);
        if ((_Rb_tree_header *)iVar7._M_node == &local_78._M_impl.super__Rb_tree_header) {
          local_118 = (undefined1  [8])0x0;
          _Stack_110._0_8_ = (pointer)0x0;
          _Stack_110._M_parent = (_Base_ptr)0x0;
          _Stack_110._M_left = &_Stack_110;
          local_f0 = 0;
          sStack_e8 = 0;
          local_d8._0_8_ = __k->m_start;
          local_d8._8_8_ = __k->m_size;
          _Stack_110._M_right = _Stack_110._M_left;
          TagInfo::TagInfo((TagInfo *)(local_d8 + 0x10),(TagInfo *)local_118);
          pVar14 = std::
                   _Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<Catch::StringRef,Catch::TagInfo>>
                             ((_Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,Catch::Detail::CaseInsensitiveLess,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                               *)&local_78,(pair<Catch::StringRef,_Catch::TagInfo> *)local_d8);
          iVar7._M_node = (_Base_ptr)pVar14.first._M_node;
          std::
          _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
          ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                       *)(local_d8 + 0x10));
          std::
          _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
          ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                       *)local_118);
        }
        SVar15.m_start = __k->m_start;
        SVar15.m_size = __k->m_size;
        TagInfo::add((TagInfo *)&iVar7._M_node[1]._M_left,SVar15);
      }
    }
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = (pointer)0x0;
    local_c8._M_allocated_capacity = 0;
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::reserve
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_d8,
               local_78._M_impl.super__Rb_tree_header._M_node_count);
    reporter = local_88;
    config = local_e0;
    for (p_Var8 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &local_78._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::emplace_back<Catch::TagInfo>
                ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_d8,
                 (TagInfo *)&p_Var8[1]._M_left);
    }
    (*reporter->_vptr_IEventListener[0x17])(reporter,local_d8);
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::~vector
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_d8);
    std::
    _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
    ::~_Rb_tree(&local_78);
    std::_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::~_Vector_base
              (&local_48);
    cVar11 = '\x01';
  }
  if ((config->m_data).listReporters == true) {
    local_118 = (undefined1  [8])0x0;
    _Stack_110._0_8_ = (pointer)0x0;
    _Stack_110._M_parent = (_Base_ptr)0x0;
    pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar5 = (*(pSVar9->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar9);
    lVar2 = *(long *)CONCAT44(extraout_var_01,iVar5);
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::reserve
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_118,*(size_type *)(lVar2 + 0x40));
    for (p_Var10 = *(_Rb_tree_node_base **)(lVar2 + 0x30);
        p_Var10 != (_Rb_tree_node_base *)(lVar2 + 0x20);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      std::__cxx11::string::string((string *)local_d8,(string *)(p_Var10 + 1));
      (**(code **)(**(long **)(p_Var10 + 2) + 0x18))(local_b8);
      std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
      emplace_back<Catch::ReporterDescription>
                ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                 local_118,(ReporterDescription *)local_d8);
      ReporterDescription::~ReporterDescription((ReporterDescription *)local_d8);
    }
    (*reporter->_vptr_IEventListener[0x14])(reporter,local_118);
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::~vector
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_118);
    cVar11 = '\x01';
    config = local_e0;
  }
  if ((config->m_data).listListeners == true) {
    local_118 = (undefined1  [8])0x0;
    _Stack_110._0_8_ = (pointer)0x0;
    _Stack_110._M_parent = (_Base_ptr)0x0;
    pSVar9 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar5 = (*(pSVar9->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar9);
    plVar3 = *(long **)CONCAT44(extraout_var_02,iVar5);
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::reserve
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_118,plVar3[1] - *plVar3 >> 3);
    puVar4 = (undefined8 *)plVar3[1];
    for (puVar12 = (undefined8 *)*plVar3; puVar12 != puVar4; puVar12 = puVar12 + 1) {
      SVar15 = (StringRef)(**(code **)(*(long *)*puVar12 + 0x18))();
      local_d8 = (undefined1  [16])SVar15;
      (**(code **)(*(long *)*puVar12 + 0x20))((string *)(local_d8 + 0x10));
      std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
      emplace_back<Catch::ListenerDescription>
                ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
                 local_118,(ListenerDescription *)local_d8);
      std::__cxx11::string::~string((string *)(local_d8 + 0x10));
    }
    (*reporter->_vptr_IEventListener[0x15])(reporter,local_118);
    std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::~vector
              ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
               local_118);
    cVar11 = '\x01';
  }
  return (bool)cVar11;
}

Assistant:

bool list( IEventListener& reporter, Config const& config ) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter);
        }
        if ( config.listListeners() ) {
            listed = true;
            listListeners( reporter );
        }
        return listed;
    }